

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O3

void __thiscall Liby::UdpSocket::handleReadEvent(UdpSocket *this)

{
  UdpConnection *pUVar1;
  ssize_t sVar2;
  iterator iVar3;
  int *piVar4;
  uint uVar5;
  shared_ptr<Liby::UdpConnection> uconn;
  Endpoint peer;
  char buffer [4096];
  undefined1 local_1089;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1088;
  UdpConnection *local_1080;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1078;
  _Any_data *local_1070;
  pair<Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_> local_1068;
  _Any_data *local_1050;
  _Base_ptr local_1048;
  Endpoint local_1040;
  char local_1038 [4104];
  
  local_1088 = (this->self_).super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  if (local_1088 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_1088->_M_use_count = local_1088->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_1088->_M_use_count = local_1088->_M_use_count + 1;
    }
  }
  local_1048 = &(this->conns_)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1070 = (_Any_data *)&this->readEventCallback_;
  local_1050 = (_Any_data *)&this->acceptorCallback_;
  while( true ) {
    sVar2 = recvfrom(((this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->fd_,local_1038,0x1000,0,(sockaddr *)&handleReadEvent::address,
                     &handleReadEvent::addr_len);
    uVar5 = (uint)sVar2;
    if ((int)uVar5 < 0) break;
    Endpoint::Endpoint(&local_1040,&handleReadEvent::address);
    iVar3 = std::
            _Rb_tree<Liby::Endpoint,_std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>,_std::_Select1st<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>,_std::less<Liby::Endpoint>,_std::allocator<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>_>
            ::find(&(this->conns_)._M_t,&local_1040);
    if (iVar3._M_node == local_1048) {
      local_1068.first = (Endpoint)this;
      std::__shared_ptr<Liby::UdpConnection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<Liby::UdpConnection>,Liby::UdpSocket*,Liby::Endpoint&>
                ((__shared_ptr<Liby::UdpConnection,(__gnu_cxx::_Lock_policy)2> *)&local_1080,
                 (allocator<Liby::UdpConnection> *)&local_1089,(UdpSocket **)&local_1068,&local_1040
                );
      local_1068.first = local_1040;
      local_1068.second.super___shared_ptr<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_1080;
      local_1068.second.super___shared_ptr<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = local_1078;
      if (local_1078 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_1078->_M_use_count = local_1078->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_1078->_M_use_count = local_1078->_M_use_count + 1;
        }
      }
      std::
      _Rb_tree<Liby::Endpoint,std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>,std::_Select1st<std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>>,std::less<Liby::Endpoint>,std::allocator<std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>>>
      ::_M_emplace_unique<std::pair<Liby::Endpoint,std::shared_ptr<Liby::UdpConnection>>>
                ((_Rb_tree<Liby::Endpoint,std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>,std::_Select1st<std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>>,std::less<Liby::Endpoint>,std::allocator<std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>>>
                  *)&this->conns_,&local_1068);
      if (local_1068.second.super___shared_ptr<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1068.second.
                   super___shared_ptr<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if ((this->acceptorCallback_).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(this->acceptorCallback_)._M_invoker)(local_1050,local_1080);
      }
      Buffer::append(&local_1080->readBuf_,local_1038,(ulong)(uVar5 & 0x7fffffff));
      if ((this->readEventCallback_).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(this->readEventCallback_)._M_invoker)(local_1070,local_1080);
      }
      if (local_1078 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1078);
      }
    }
    else {
      pUVar1 = (UdpConnection *)iVar3._M_node[1]._M_parent;
      Buffer::append(&pUVar1->readBuf_,local_1038,(ulong)(uVar5 & 0x7fffffff));
      if ((this->readEventCallback_).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(this->readEventCallback_)._M_invoker)(local_1070,pUVar1);
      }
    }
  }
  piVar4 = __errno_location();
  if (*piVar4 != 0xb) {
    handleErroEvent(this);
  }
  if (local_1088 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1088);
  }
  return;
}

Assistant:

void UdpSocket::handleReadEvent() {
    auto self = self_;

    char buffer[4096];

    for (;;) {
        static struct sockaddr_in address;
        static socklen_t addr_len = sizeof(struct sockaddr_in);

        int n = socket_->recvfrom(buffer, sizeof(buffer), 0,
                                  (struct sockaddr *)&address, &addr_len);

        if (n < 0) {
            if (errno != EAGAIN) {
                handleErroEvent();
            }
            break;
        }

        Endpoint peer(&address);
        auto it = conns_.find(peer);
        if (it == conns_.end()) {
            // a new udp conn
            auto uconn = std::make_shared<UdpConnection>(this, peer);
            conns_.insert(std::make_pair(peer, uconn));
            if (acceptorCallback_) {
                acceptorCallback_(*uconn);
            }
            uconn->getReadBuf().append(buffer, n);
            if (readEventCallback_) {
                readEventCallback_(*uconn);
            }
        } else {
            UdpConnection &uconn = *(it->second);
            uconn.getReadBuf().append(buffer, n);
            if (readEventCallback_) {
                readEventCallback_(uconn);
            }
        }
    }
}